

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryReader::readMemories(WasmBinaryReader *this)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  ostream *poVar5;
  type *ptVar6;
  pointer pMVar7;
  pointer pMVar8;
  pointer pMVar9;
  pointer pMVar10;
  char *pcVar11;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar12;
  string_view sVar13;
  Name name_00;
  Name name_01;
  Name name_02;
  Type in_stack_fffffffffffffe08;
  Address local_158;
  Type local_150;
  Address local_148;
  Address local_140;
  char *local_138;
  Address AStack_130;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_128;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  type_conflict1 *isExplicit;
  type *name_1;
  string local_108;
  string_view local_e8;
  pair<wasm::Name,_bool> local_d8;
  ulong local_c0;
  size_t i;
  undefined1 local_b0;
  ostream *local_a8;
  char *pcStack_a0;
  type *local_88;
  type *name;
  type *index;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false> local_70;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *__range1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  size_type numImports;
  uint32_t num;
  WasmBinaryReader *this_local;
  
  uVar3 = getU32LEB(this);
  usedNames._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
       ::size(&this->wasm->memories);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&__range1);
  __end1 = std::
           unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
           ::begin(&this->memoryNames);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
       ::end(&this->memoryNames);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>,
                       &local_70);
    if (!bVar2) break;
    index = &std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>
             ::operator*(&__end1)->first;
    name = (type *)std::get<0ul,unsigned_int_const,wasm::Name>
                             ((pair<const_unsigned_int,_wasm::Name> *)index);
    local_88 = std::get<1ul,unsigned_int_const,wasm::Name>
                         ((pair<const_unsigned_int,_wasm::Name> *)index);
    pcVar11 = (char *)((long)&(usedNames._M_h._M_single_bucket)->_M_nxt + (ulong)uVar3);
    if (pcVar11 <= (char *)(ulong)(uint)(name->super_IString).str._M_len) {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "warning: memory index out of bounds in name section: ");
      local_a8 = (ostream *)(local_88->super_IString).str._M_len;
      pcStack_a0 = (local_88->super_IString).str._M_str;
      name_01.super_IString.str._M_str = pcVar11;
      name_01.super_IString.str._M_len = (size_t)pcStack_a0;
      poVar5 = wasm::operator<<((wasm *)poVar5,local_a8,name_01);
      poVar5 = std::operator<<(poVar5," at index ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)(name->super_IString).str._M_len);
      std::operator<<(poVar5,'\n');
    }
    pVar12 = std::
             unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
             ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&__range1,local_88);
    i = (size_t)pVar12.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
    local_b0 = pVar12.second;
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::
    operator++(&__end1);
  }
  for (local_c0 = 0; local_c0 < uVar3; local_c0 = local_c0 + 1) {
    uVar4 = (int)usedNames._M_h._M_single_bucket + (int)local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"",(allocator<char> *)((long)&name_1 + 7));
    sVar13 = (string_view)makeName(&local_108,local_c0);
    name_02.super_IString.str._M_str = (char *)&__range1;
    name_02.super_IString.str._M_len = (size_t)sVar13._M_str;
    local_e8 = sVar13;
    getOrMakeName(&local_d8,(wasm *)&this->memoryNames,
                  (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                   *)(ulong)uVar4,(Index)sVar13._M_len,name_02,
                  (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)in_stack_fffffffffffffe08.id);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)((long)&name_1 + 7));
    ptVar6 = std::get<0ul,wasm::Name,bool>(&local_d8);
    memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
         std::get<1ul,wasm::Name,bool>(&local_d8);
    local_138 = (char *)(ptVar6->super_IString).str._M_len;
    AStack_130.addr = (address64_t)(ptVar6->super_IString).str._M_str;
    wasm::Address::Address(&local_140,0);
    wasm::Address::Address(&local_148,0x10000);
    wasm::Type::Type(&local_150,i32);
    name_00.super_IString.str._M_str = local_138;
    name_00.super_IString.str._M_len = (size_t)&local_128;
    in_stack_fffffffffffffe08.id = local_150.id;
    Builder::makeMemory(name_00,AStack_130,local_140,SUB81(local_148.addr,0),(Type)0x0);
    bVar1 = *(byte *)memory._M_t.
                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                     super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pMVar7 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_128);
    (pMVar7->super_Importable).super_Named.hasExplicitName = (bool)(bVar1 & 1);
    pMVar7 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_128);
    pMVar8 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_128);
    pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_128);
    pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                        (&local_128);
    wasm::Address::Address(&local_158,0xffffffffffffffff);
    getResizableLimits(this,&pMVar7->initial,&pMVar8->max,&pMVar9->shared,&pMVar10->addressType,
                       local_158);
    Module::addMemory(this->wasm,&local_128);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_128);
  }
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&__range1);
  return;
}

Assistant:

void WasmBinaryReader::readMemories() {
  auto num = getU32LEB();
  auto numImports = wasm.memories.size();
  std::unordered_set<Name> usedNames;
  for (auto& [index, name] : memoryNames) {
    if (index >= num + numImports) {
      std::cerr << "warning: memory index out of bounds in name section: "
                << name << " at index " << index << '\n';
    }
    usedNames.insert(name);
  }
  for (size_t i = 0; i < num; i++) {
    auto [name, isExplicit] =
      getOrMakeName(memoryNames, numImports + i, makeName("", i), usedNames);
    auto memory = Builder::makeMemory(name);
    memory->hasExplicitName = isExplicit;
    getResizableLimits(memory->initial,
                       memory->max,
                       memory->shared,
                       memory->addressType,
                       Memory::kUnlimitedSize);
    wasm.addMemory(std::move(memory));
  }
}